

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O1

int SUNMemoryHelper_CopyAsync
              (SUNMemoryHelper helper,SUNMemory dst,SUNMemory src,size_t memory_size,void *queue)

{
  int iVar1;
  _func_int_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = helper->ops->copyasync;
  if ((UNRECOVERED_JUMPTABLE == (_func_int_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *)0x0
      ) && (UNRECOVERED_JUMPTABLE = helper->ops->copy,
           UNRECOVERED_JUMPTABLE ==
           (_func_int_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *)0x0)) {
    return -1;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(helper,dst,src,memory_size,queue);
  return iVar1;
}

Assistant:

int SUNMemoryHelper_CopyAsync(SUNMemoryHelper helper, SUNMemory dst,
                              SUNMemory src, size_t memory_size,
                              void* queue)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (helper->ops->copyasync == NULL)
    ier = SUNMemoryHelper_Copy(helper, dst, src, memory_size, queue);
  else
    ier = helper->ops->copyasync(helper, dst, src, memory_size, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return(ier);
}